

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3MsrBufferData(Fts3MultiSegReader *pMsr,char *pList,int nList)

{
  char *pOld;
  uint uVar1;
  int iVar2;
  char *nBytes;
  
  if (pMsr->nBuffer < nList) {
    uVar1 = nList * 2;
    pMsr->nBuffer = uVar1;
    pOld = pMsr->aBuffer;
    iVar2 = sqlite3_initialize();
    nBytes = (char *)0x0;
    if (iVar2 == 0) {
      if (0 < (int)uVar1) {
        nBytes = (char *)(ulong)uVar1;
      }
      nBytes = (char *)sqlite3Realloc(pOld,(u64)nBytes);
    }
    if (nBytes == (char *)0x0) {
      return 7;
    }
    pMsr->aBuffer = nBytes;
  }
  memcpy(pMsr->aBuffer,pList,(long)nList);
  return 0;
}

Assistant:

static int fts3MsrBufferData(
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  char *pList,
  int nList
){
  if( nList>pMsr->nBuffer ){
    char *pNew;
    pMsr->nBuffer = nList*2;
    pNew = (char *)sqlite3_realloc(pMsr->aBuffer, pMsr->nBuffer);
    if( !pNew ) return SQLITE_NOMEM;
    pMsr->aBuffer = pNew;
  }

  memcpy(pMsr->aBuffer, pList, nList);
  return SQLITE_OK;
}